

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3RefillIndex(Parse *pParse,Index *pIndex,int memRootPage)

{
  int iCur;
  Table *pTab;
  sqlite3 *psVar1;
  u8 uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Vdbe *p;
  KeyInfo *zP4;
  long lVar8;
  int iVar9;
  Schema **ppSVar10;
  int p2;
  ulong uVar11;
  
  pTab = pIndex->pTable;
  iCur = pParse->nTab;
  pParse->nTab = iCur + 2;
  psVar1 = pParse->db;
  if (pIndex->pSchema == (Schema *)0x0) {
    uVar11 = 0xfff0bdc0;
  }
  else {
    uVar7 = psVar1->nDb;
    if ((int)uVar7 < 1) {
      uVar11 = 0;
    }
    else {
      ppSVar10 = &psVar1->aDb->pSchema;
      uVar11 = 0;
      do {
        if (*ppSVar10 == pIndex->pSchema) goto LAB_0018a86b;
        uVar11 = uVar11 + 1;
        ppSVar10 = ppSVar10 + 4;
      } while (uVar7 != uVar11);
      uVar11 = (ulong)uVar7;
    }
  }
LAB_0018a86b:
  iVar9 = (int)uVar11;
  iVar4 = sqlite3AuthCheck(pParse,0x1b,pIndex->zName,(char *)0x0,psVar1->aDb[iVar9].zName);
  if (iVar4 == 0) {
    sqlite3TableLock(pParse,iVar9,pTab->tnum,'\x01',pTab->zName);
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      iVar4 = iCur + 1;
      uVar2 = '\x03';
      if (memRootPage < 0) {
        memRootPage = pIndex->tnum;
        sqlite3VdbeAddOp3(p,0x67,memRootPage,iVar9,0);
        uVar2 = '\x01';
      }
      zP4 = sqlite3IndexKeyinfo(pParse,pIndex);
      iVar5 = sqlite3VdbeAddOp3(p,0x28,iVar4,memRootPage,iVar9);
      sqlite3VdbeChangeP4(p,iVar5,(char *)zP4,-0x10);
      if (p->aOp != (Op *)0x0) {
        p->aOp[(long)p->nOp + -1].p5 = uVar2;
      }
      iVar5 = pParse->nTab;
      pParse->nTab = iVar5 + 1;
      iVar6 = sqlite3VdbeAddOp3(p,0x2b,iVar5,0,0);
      sqlite3VdbeChangeP4(p,iVar6,(char *)zP4,-6);
      sqlite3OpenTable(pParse,iCur,iVar9,pTab,0x27);
      uVar7 = sqlite3VdbeAddOp3(p,0x48,iCur,0,0);
      if (pParse->nTempReg == '\0') {
        iVar9 = pParse->nMem + 1;
        pParse->nMem = iVar9;
      }
      else {
        bVar3 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar3;
        iVar9 = pParse->aTempReg[bVar3];
      }
      sqlite3GenerateIndexKey(pParse,pIndex,iCur,iVar9,1);
      sqlite3VdbeAddOp3(p,0x60,iVar5,iVar9,0);
      sqlite3VdbeAddOp3(p,0x5f,iCur,uVar7 + 1,0);
      if ((-1 < (int)uVar7) && (uVar7 < (uint)p->nOp)) {
        p->aOp[uVar7].p2 = p->nOp;
      }
      uVar7 = sqlite3VdbeAddOp3(p,0x46,iVar5,0,0);
      iVar6 = p->nOp;
      if (pIndex->onError != '\0') {
        p2 = iVar6 + 3;
        sqlite3VdbeAddOp3(p,1,0,p2,0);
        iVar6 = p->nOp;
        sqlite3VdbeAddOp3(p,0x3d,iVar5,p2,iVar9);
        sqlite3HaltConstraint(pParse,0x813,2,"indexed columns are not unique",-2);
      }
      sqlite3VdbeAddOp3(p,0x3e,iVar5,iVar9,0);
      sqlite3VdbeAddOp3(p,0x61,iVar4,iVar9,1);
      if (p->aOp != (Op *)0x0) {
        p->aOp[(long)p->nOp + -1].p5 = '\x10';
      }
      if (iVar9 != 0) {
        bVar3 = pParse->nTempReg;
        if ((ulong)bVar3 < 8) {
          lVar8 = 0;
          do {
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar8) == iVar9) {
              (&pParse->aColCache[0].tempReg)[lVar8] = '\x01';
              goto LAB_0018ab33;
            }
            lVar8 = lVar8 + 0x18;
          } while ((int)lVar8 != 0xf0);
          pParse->nTempReg = bVar3 + 1;
          pParse->aTempReg[bVar3] = iVar9;
        }
      }
LAB_0018ab33:
      sqlite3VdbeAddOp3(p,0x51,iVar5,iVar6,0);
      if ((-1 < (int)uVar7) && (uVar7 < (uint)p->nOp)) {
        p->aOp[uVar7].p2 = p->nOp;
      }
      sqlite3VdbeAddOp3(p,0x2d,iCur,0,0);
      sqlite3VdbeAddOp3(p,0x2d,iVar4,0,0);
      sqlite3VdbeAddOp3(p,0x2d,iVar5,0,0);
      return;
    }
  }
  return;
}

Assistant:

static void sqlite3RefillIndex(Parse *pParse, Index *pIndex, int memRootPage){
  Table *pTab = pIndex->pTable;  /* The table that is indexed */
  int iTab = pParse->nTab++;     /* Btree cursor used for pTab */
  int iIdx = pParse->nTab++;     /* Btree cursor used for pIndex */
  int iSorter;                   /* Cursor opened by OpenSorter (if in use) */
  int addr1;                     /* Address of top of loop */
  int addr2;                     /* Address to jump to for next iteration */
  int tnum;                      /* Root page of index */
  Vdbe *v;                       /* Generate code into this virtual machine */
  KeyInfo *pKey;                 /* KeyInfo for index */
  int regRecord;                 /* Register holding assemblied index record */
  sqlite3 *db = pParse->db;      /* The database connection */
  int iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_REINDEX, pIndex->zName, 0,
      db->aDb[iDb].zName ) ){
    return;
  }
#endif

  /* Require a write-lock on the table to perform this operation */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);

  v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  if( memRootPage>=0 ){
    tnum = memRootPage;
  }else{
    tnum = pIndex->tnum;
    sqlite3VdbeAddOp2(v, OP_Clear, tnum, iDb);
  }
  pKey = sqlite3IndexKeyinfo(pParse, pIndex);
  sqlite3VdbeAddOp4(v, OP_OpenWrite, iIdx, tnum, iDb, 
                    (char *)pKey, P4_KEYINFO_HANDOFF);
  sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR|((memRootPage>=0)?OPFLAG_P2ISREG:0));

  /* Open the sorter cursor if we are to use one. */
  iSorter = pParse->nTab++;
  sqlite3VdbeAddOp4(v, OP_SorterOpen, iSorter, 0, 0, (char*)pKey, P4_KEYINFO);

  /* Open the table. Loop through all rows of the table, inserting index
  ** records into the sorter. */
  sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
  addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, 0);
  regRecord = sqlite3GetTempReg(pParse);

  sqlite3GenerateIndexKey(pParse, pIndex, iTab, regRecord, 1);
  sqlite3VdbeAddOp2(v, OP_SorterInsert, iSorter, regRecord);
  sqlite3VdbeAddOp2(v, OP_Next, iTab, addr1+1);
  sqlite3VdbeJumpHere(v, addr1);
  addr1 = sqlite3VdbeAddOp2(v, OP_SorterSort, iSorter, 0);
  if( pIndex->onError!=OE_None ){
    int j2 = sqlite3VdbeCurrentAddr(v) + 3;
    sqlite3VdbeAddOp2(v, OP_Goto, 0, j2);
    addr2 = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp3(v, OP_SorterCompare, iSorter, j2, regRecord);
    sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_UNIQUE,
        OE_Abort, "indexed columns are not unique", P4_STATIC
    );
  }else{
    addr2 = sqlite3VdbeCurrentAddr(v);
  }
  sqlite3VdbeAddOp2(v, OP_SorterData, iSorter, regRecord);
  sqlite3VdbeAddOp3(v, OP_IdxInsert, iIdx, regRecord, 1);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3VdbeAddOp2(v, OP_SorterNext, iSorter, addr2);
  sqlite3VdbeJumpHere(v, addr1);

  sqlite3VdbeAddOp1(v, OP_Close, iTab);
  sqlite3VdbeAddOp1(v, OP_Close, iIdx);
  sqlite3VdbeAddOp1(v, OP_Close, iSorter);
}